

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O2

int run_test_poll_oob(void)

{
  int iVar1;
  uv_loop_t *loop;
  int *piVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    loop = uv_default_loop();
    iVar1 = uv_tcp_init(loop,&server_handle);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_tcp_init(loop,&client_handle);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_tcp_init(loop,&peer_handle);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_idle_init(loop,&idle);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            iVar1 = uv_tcp_bind(&server_handle,(sockaddr *)&addr,0);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              iVar1 = uv_listen((uv_stream_t *)&server_handle,1,connection_cb);
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a == 0) {
                iVar1 = uv_tcp_nodelay(&client_handle,1);
                eval_a = (int64_t)iVar1;
                eval_b = 0;
                if (eval_a == 0) {
                  client_fd = socket(2,1,0);
                  eval_a = (int64_t)client_fd;
                  eval_b = 0;
                  if (eval_a < 0) {
                    pcVar5 = ">=";
                    pcVar6 = "0";
                    pcVar4 = "client_fd";
                    uVar3 = 0xb4;
                  }
                  else {
                    piVar2 = __errno_location();
                    do {
                      *piVar2 = 0;
                      iVar1 = connect(client_fd,(sockaddr *)&addr,0x10);
                      if (iVar1 != -1) break;
                    } while (*piVar2 == 4);
                    eval_a = (int64_t)iVar1;
                    eval_b = 0;
                    if (eval_a == 0) {
                      iVar1 = uv_run(loop,UV_RUN_DEFAULT);
                      eval_a = (int64_t)iVar1;
                      eval_b = 0;
                      if (eval_a == 0) {
                        eval_a = (int64_t)ticks;
                        eval_b = 10;
                        if (eval_a == 10) {
                          eval_a = 1;
                          eval_b = (int64_t)cli_pr_check;
                          if (eval_b == 1) {
                            eval_a = 2;
                            eval_b = (int64_t)(uint)cli_rd_check;
                            if (eval_b == 2) {
                              eval_a = 1;
                              eval_b = (int64_t)srv_rd_check;
                              if (eval_b == 1) {
                                uv_walk(loop,close_walk_cb,(void *)0x0);
                                uv_run(loop,UV_RUN_DEFAULT);
                                eval_a = 0;
                                iVar1 = uv_loop_close(loop);
                                eval_b = (int64_t)iVar1;
                                if (eval_b == 0) {
                                  uv_library_shutdown();
                                  return 0;
                                }
                                pcVar5 = "==";
                                pcVar6 = "uv_loop_close(loop)";
                                pcVar4 = "0";
                                uVar3 = 200;
                              }
                              else {
                                pcVar5 = "==";
                                pcVar6 = "srv_rd_check";
                                pcVar4 = "1";
                                uVar3 = 0xc6;
                              }
                            }
                            else {
                              pcVar5 = "==";
                              pcVar6 = "cli_rd_check";
                              pcVar4 = "2";
                              uVar3 = 0xc2;
                            }
                          }
                          else {
                            pcVar5 = "==";
                            pcVar6 = "cli_pr_check";
                            pcVar4 = "1";
                            uVar3 = 0xc0;
                          }
                        }
                        else {
                          pcVar5 = "==";
                          pcVar6 = "kMaxTicks";
                          pcVar4 = "ticks";
                          uVar3 = 0xbd;
                        }
                      }
                      else {
                        pcVar5 = "==";
                        pcVar6 = "0";
                        pcVar4 = "uv_run(loop, UV_RUN_DEFAULT)";
                        uVar3 = 0xbb;
                      }
                    }
                    else {
                      pcVar5 = "==";
                      pcVar6 = "0";
                      pcVar4 = "r";
                      uVar3 = 0xb9;
                    }
                  }
                }
                else {
                  pcVar5 = "==";
                  pcVar6 = "0";
                  pcVar4 = "uv_tcp_nodelay(&client_handle, 1)";
                  uVar3 = 0xb1;
                }
              }
              else {
                pcVar5 = "==";
                pcVar6 = "0";
                pcVar4 = "uv_listen((uv_stream_t*) &server_handle, 1, connection_cb)";
                uVar3 = 0xae;
              }
            }
            else {
              pcVar5 = "==";
              pcVar6 = "0";
              pcVar4 = "uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0)";
              uVar3 = 0xad;
            }
          }
          else {
            pcVar5 = "==";
            pcVar6 = "0";
            pcVar4 = "uv_idle_init(loop, &idle)";
            uVar3 = 0xac;
          }
        }
        else {
          pcVar5 = "==";
          pcVar6 = "0";
          pcVar4 = "uv_tcp_init(loop, &peer_handle)";
          uVar3 = 0xab;
        }
      }
      else {
        pcVar5 = "==";
        pcVar6 = "0";
        pcVar4 = "uv_tcp_init(loop, &client_handle)";
        uVar3 = 0xaa;
      }
    }
    else {
      pcVar5 = "==";
      pcVar6 = "0";
      pcVar4 = "uv_tcp_init(loop, &server_handle)";
      uVar3 = 0xa9;
    }
  }
  else {
    pcVar5 = "==";
    pcVar6 = "0";
    pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar3 = 0xa6;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,eval_a,pcVar5,eval_b);
  abort();
}

Assistant:

TEST_IMPL(poll_oob) {
  struct sockaddr_in addr;
  int r = 0;
  uv_loop_t* loop;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT_OK(uv_tcp_init(loop, &server_handle));
  ASSERT_OK(uv_tcp_init(loop, &client_handle));
  ASSERT_OK(uv_tcp_init(loop, &peer_handle));
  ASSERT_OK(uv_idle_init(loop, &idle));
  ASSERT_OK(uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT_OK(uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT_OK(uv_tcp_nodelay(&client_handle, 1));

  client_fd = socket(PF_INET, SOCK_STREAM, 0);
  ASSERT_GE(client_fd, 0);
  do {
    errno = 0;
    r = connect(client_fd, (const struct sockaddr*)&addr, sizeof(addr));
  } while (r == -1 && errno == EINTR);
  ASSERT_OK(r);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_EQ(ticks, kMaxTicks);

  /* Did client receive the POLLPRI message */
  ASSERT_EQ(1, cli_pr_check);
  /* Did client receive the POLLIN message */
  ASSERT_EQ(2, cli_rd_check);
  /* Could we write with POLLOUT and did the server receive our POLLOUT message
   * through POLLIN.
   */
  ASSERT_EQ(1, srv_rd_check);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}